

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O1

Image * rw::gl3::rasterToImage(Raster *raster)

{
  uint8 *puVar1;
  int iVar2;
  Image *this;
  uint uVar3;
  int32 depth;
  int iVar4;
  uint8 *puVar5;
  code *pcVar6;
  uint8 *local_48;
  
  puVar1 = raster->pixels;
  if (puVar1 == (uint8 *)0x0) {
    Raster::lock(raster,0,2);
  }
  if (*(char *)((long)&raster->width + (long)nativeRasterOffset) == '\x01') {
    rasterToImage();
  }
  else {
    uVar3 = (raster->format & 0xf00U) - 0x100 >> 8;
    if (uVar3 == 0) {
      depth = 0x10;
      pcVar6 = conv_ARGB1555_from_RGBA5551;
    }
    else if (uVar3 == 5) {
      depth = 0x18;
      pcVar6 = conv_RGB888_from_RGB888;
    }
    else {
      if (uVar3 != 4) {
        rasterToImage();
        return (Image *)0x0;
      }
      depth = 0x20;
      pcVar6 = conv_RGBA8888_from_RGBA8888;
    }
    if ((raster->format & 0x6000U) == 0) {
      this = Image::create(raster->width,raster->height,depth);
      Image::allocate(this);
      if (0 < this->height) {
        local_48 = this->pixels + (long)this->stride * ((long)this->height + -1);
        iVar2 = 0;
        do {
          if (0 < this->width) {
            iVar4 = 0;
            puVar5 = local_48;
            do {
              (*pcVar6)(puVar5);
              puVar5 = puVar5 + this->bpp;
              iVar4 = iVar4 + 1;
            } while (iVar4 < this->width);
          }
          local_48 = local_48 + -(long)this->stride;
          iVar2 = iVar2 + 1;
        } while (iVar2 < this->height);
      }
      if (puVar1 == (uint8 *)0x0) {
        Raster::unlock(raster,0);
        return this;
      }
      return this;
    }
    rasterToImage();
  }
  return (Image *)0x0;
}

Assistant:

Image*
rasterToImage(Raster *raster)
{
	int32 depth;
	Image *image;

	bool unlock = false;
	if(raster->pixels == nil){
		raster->lock(0, Raster::LOCKREAD);
		unlock = true;
	}

	Gl3Raster *natras = GETGL3RASTEREXT(raster);
	if(natras->isCompressed){
		// TODO
		RWERROR((ERR_INVRASTER));
		return nil;
	}

	void (*conv)(uint8 *out, uint8 *in) = nil;
	switch(raster->format & 0xF00){
	case Raster::C1555:
		depth = 16;
		conv = conv_ARGB1555_from_RGBA5551;
		break;
	case Raster::C8888:
		depth = 32;
		conv = conv_RGBA8888_from_RGBA8888;
		break;
	case Raster::C888:
		depth = 24;
		conv = conv_RGB888_from_RGB888;
		break;

	default:
	case Raster::C555:
	case Raster::C565:
	case Raster::C4444:
	case Raster::LUM8:
		RWERROR((ERR_INVRASTER));
		return nil;
	}

	if(raster->format & Raster::PAL4 ||
	   raster->format & Raster::PAL8){
		RWERROR((ERR_INVRASTER));
		return nil;
	}
		
	uint8 *in, *out;
	image = Image::create(raster->width, raster->height, depth);
	image->allocate();

	uint8 *imgpixels = image->pixels + (image->height-1)*image->stride;
	uint8 *pixels = raster->pixels;

	int x, y;
	assert(image->width == raster->width);
	assert(image->height == raster->height);
	for(y = 0; y < image->height; y++){
		uint8 *imgrow = imgpixels;
		uint8 *rasrow = pixels;
		for(x = 0; x < image->width; x++){
			conv(imgrow, rasrow);
			imgrow += image->bpp;
			rasrow += natras->bpp;
		}
		imgpixels -= image->stride;
		pixels += raster->stride;
	}

	if(unlock)
		raster->unlock(0);

	return image;
}